

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O3

void __thiscall sfm::FeatureSet::compute_features(FeatureSet *this,Ptr *image)

{
  pointer pVVar1;
  pointer pVVar2;
  element_type *peVar3;
  ConstPtr local_38;
  ConstPtr local_28;
  
  pVVar1 = (this->colors).
           super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colors).
      super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->colors).
    super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  pVVar2 = (this->positions).
           super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->positions).
      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar2) {
    (this->positions).
    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  peVar3 = (image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this->width = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  this->height = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
  if (((this->opts).feature_types & FEATURE_SIFT) != 0) {
    local_38.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_38.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_38.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar3;
    compute_sift(this,&local_38);
    if (local_38.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (((this->opts).feature_types & FEATURE_SURF) != 0) {
    local_28.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
    local_28.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (image->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_28.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_28.
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_28.
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    compute_surf(this,&local_28);
    if (local_28.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return;
    }
  }
  return;
}

Assistant:

void
FeatureSet::compute_features (core::ByteImage::Ptr image)
{
    this->colors.clear();
    this->positions.clear();
    this->width = image->width();
    this->height = image->height();

    /* Make sure these are in the right order. Matching relies on it. */
    if (this->opts.feature_types & FEATURE_SIFT)
        this->compute_sift(image);
    if (this->opts.feature_types & FEATURE_SURF)
        this->compute_surf(image);
}